

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::reset(Solver *this)

{
  double *pdVar1;
  int32_t *piVar2;
  Solver *this_local;
  
  this->ok = true;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_K);
  this->K = *pdVar1;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_R);
  this->R = *pdVar1;
  piVar2 = IntOption::operator_cast_to_int_(&opt_first_reduce_db);
  this->firstReduceDB = *piVar2;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_var_decay);
  this->var_decay = *pdVar1;
  this->conflictsRestarts = 0;
  this->conflicts = 0;
  this->propagations = 0;
  this->decisions = 0;
  this->starts = 0;
  this->solves = 0;
  this->curRestart = 1;
  this->var_inc = 1.0;
  this->cla_inc = 1.0;
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::clear
            (&this->watches,false);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::clear
            (&this->watchesBin,false);
  this->qhead = 0;
  this->simpDB_assigns = -1;
  this->simpDB_props = 0;
  Heap<Gluco::Solver::VarOrderLt>::clear(&this->order_heap,false);
  this->progress_estimate = 0.0;
  this->conflict_budget = -1;
  this->propagation_budget = -1;
  this->nbVarsInitialFormula = 0x7fffffff;
  this->totalTime4Sat = 0.0;
  this->totalTime4Unsat = 0.0;
  this->nbUnsatCalls = 0;
  this->nbSatCalls = 0;
  this->MYFLAG = 0;
  bqueue<unsigned_int>::clear(&this->lbdQueue,false);
  bqueue<unsigned_int>::initSize(&this->lbdQueue,(int)this->sizeLBDQueue);
  bqueue<unsigned_int>::clear(&this->trailQueue,false);
  bqueue<unsigned_int>::initSize(&this->trailQueue,(int)this->sizeTrailQueue);
  this->sumLBD = 0.0;
  this->nbclausesbeforereduce = this->firstReduceDB;
  vec<unsigned_int>::clear(&this->clauses,false);
  vec<unsigned_int>::clear(&this->learnts,false);
  vec<Gluco::lbool>::clear(&this->model,false);
  vec<Gluco::Lit>::clear(&this->conflict,false);
  vec<double>::clear(&this->activity,false);
  vec<Gluco::lbool>::clear(&this->assigns,false);
  vec<char>::clear(&this->polarity,false);
  vec<char>::clear(&this->decision,false);
  vec<Gluco::Lit>::clear(&this->trail,false);
  vec<int>::clear(&this->nbpos,false);
  vec<int>::clear(&this->trail_lim,false);
  vec<Gluco::Solver::VarData>::clear(&this->vardata,false);
  vec<Gluco::Lit>::clear(&this->assumptions,false);
  vec<unsigned_int>::clear(&this->permDiff,false);
  vec<Gluco::Lit>::clear(&this->lastDecisionLevel,false);
  RegionAllocator<unsigned_int>::clear(&(this->ca).super_RegionAllocator<unsigned_int>);
  vec<char>::clear(&this->seen,false);
  vec<Gluco::Lit>::clear(&this->analyze_stack,false);
  vec<Gluco::Lit>::clear(&this->analyze_toclear,false);
  vec<Gluco::Lit>::clear(&this->add_tmp,false);
  vec<int>::clear(&this->assumptionPositions,false);
  vec<int>::clear(&this->initialPositions,false);
  return;
}

Assistant:

void Solver::reset() 
{
    // Reset everything
    ok = true;
    K = (double)opt_K;
    R = (double)opt_R;
    firstReduceDB = opt_first_reduce_db;
    var_decay = (double)opt_var_decay;
    //max_var_decay = opt_max_var_decay;
    solves = starts = decisions = propagations = conflicts = conflictsRestarts = 0;
    curRestart = 1;
    cla_inc = var_inc = 1;
    watches.clear(false); // We don't free the memory, new calls should be of the same size order.
    watchesBin.clear(false); 
    //unaryWatches.clear(false);
    qhead = 0;
    simpDB_assigns = -1;
    simpDB_props = 0;
    order_heap.clear(false);
    progress_estimate = 0;
    //lastLearntClause = CRef_Undef;
    conflict_budget = -1;
    propagation_budget = -1;
    nbVarsInitialFormula = INT32_MAX;
    totalTime4Sat = 0.;
    totalTime4Unsat = 0.;
    nbSatCalls = nbUnsatCalls = 0;
    MYFLAG = 0;
    lbdQueue.clear(false);
    lbdQueue.initSize(sizeLBDQueue);
    trailQueue.clear(false);
    trailQueue.initSize(sizeTrailQueue);
    sumLBD = 0;
    nbclausesbeforereduce = firstReduceDB;
    //stats.clear();
    //stats.growTo(coreStatsSize, 0);
    clauses.clear(false);
    learnts.clear(false);
    //permanentLearnts.clear(false);
    //unaryWatchedClauses.clear(false);
    model.clear(false);
    conflict.clear(false);
    activity.clear(false);
    assigns.clear(false);
    polarity.clear(false);
    //forceUNSAT.clear(false);
    decision.clear(false);
    trail.clear(false);
    nbpos.clear(false);
    trail_lim.clear(false);
    vardata.clear(false);
    assumptions.clear(false);
    permDiff.clear(false);
    lastDecisionLevel.clear(false);
    ca.clear();
    seen.clear(false);
    analyze_stack.clear(false);
    analyze_toclear.clear(false);
    add_tmp.clear(false);
    assumptionPositions.clear(false);
    initialPositions.clear(false);
}